

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::glyphEntry(GrpParser *this)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  ASTFactory *in_RDI;
  ParserException *ex;
  RefAST tmp92_AST;
  RefAST glyphEntry_AST;
  ASTPair currentAST;
  GrpParser *in_stack_00000190;
  ASTPair *in_stack_ffffffffffffff20;
  BitSet *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  RefCount<AST> *in_stack_ffffffffffffff38;
  ASTFactory *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  ASTFactory *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  int in_stack_ffffffffffffff68;
  undefined1 local_70 [8];
  RefToken *in_stack_ffffffffffffff98;
  NoViableAltException *in_stack_ffffffffffffffa0;
  undefined1 local_48 [72];
  
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  ASTPair::ASTPair((ASTPair *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (RefCount<AST> *)in_stack_ffffffffffffff28);
  iVar1 = (*in_RDI->_vptr_ASTFactory[4])(in_RDI,1);
  if (iVar1 == 0xd) {
    in_stack_ffffffffffffff68 = (*in_RDI->_vptr_ASTFactory[4])(in_RDI,2);
    in_stack_ffffffffffffff67 =
         BitSet::member(in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    if ((bool)in_stack_ffffffffffffff67) {
      glyphContents((GrpParser *)currentAST.root.ref);
      in_stack_ffffffffffffff58 = in_RDI + 3;
      RefCount<AST>::RefCount
                ((RefCount<AST> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (RefCount<AST> *)in_stack_ffffffffffffff28);
      ASTFactory::addASTChild
                (in_RDI,(ASTPair *)CONCAT44(iVar1,in_stack_ffffffffffffff68),
                 (RefAST *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      RefCount<AST>::~RefCount(&in_stack_ffffffffffffff20->root);
      goto LAB_001ff25d;
    }
  }
  in_stack_ffffffffffffff54 = (*in_RDI->_vptr_ASTFactory[4])(in_RDI,1);
  if ((in_stack_ffffffffffffff54 != 0xd) ||
     ((in_stack_ffffffffffffff50 = (*in_RDI->_vptr_ASTFactory[4])(in_RDI,2),
      in_stack_ffffffffffffff50 != 0xb &&
      (iVar2 = (*in_RDI->_vptr_ASTFactory[4])(in_RDI,2), iVar2 != 0x12)))) {
    uVar3 = __cxa_allocate_exception(0x40);
    (*in_RDI->_vptr_ASTFactory[5])(local_48,in_RDI,1);
    NoViableAltException::NoViableAltException(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  glyphAttrs(in_stack_00000190);
  in_stack_ffffffffffffff40 = in_RDI + 3;
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (RefCount<AST> *)in_stack_ffffffffffffff28);
  ASTFactory::addASTChild
            (in_RDI,(ASTPair *)CONCAT44(iVar1,in_stack_ffffffffffffff68),
             (RefAST *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  RefCount<AST>::~RefCount(&in_stack_ffffffffffffff20->root);
LAB_001ff25d:
  iVar1 = (*in_RDI->_vptr_ASTFactory[4])(in_RDI,1);
  if (iVar1 == 8) {
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(8,in_stack_ffffffffffffff30),
               (RefCount<AST> *)in_stack_ffffffffffffff28);
    (*in_RDI->_vptr_ASTFactory[5])(&stack0xffffffffffffff98,in_RDI,1);
    ASTFactory::create(in_stack_ffffffffffffff58,
                       (RefToken *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    iVar2 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    RefCount<AST>::~RefCount(&in_stack_ffffffffffffff20->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)CONCAT44(iVar1,in_stack_ffffffffffffff30));
    Parser::match((Parser *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),iVar2);
    RefCount<AST>::~RefCount(&in_stack_ffffffffffffff20->root);
  }
  else if ((1 < iVar1 - 9U) && (2 < iVar1 - 0xdU)) {
    uVar3 = __cxa_allocate_exception(0x40);
    (*in_RDI->_vptr_ASTFactory[5])(local_70,in_RDI,1);
    NoViableAltException::NoViableAltException(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  RefCount<AST>::~RefCount(&in_stack_ffffffffffffff20->root);
  ASTPair::~ASTPair(in_stack_ffffffffffffff20);
  return;
}

Assistant:

void GrpParser::glyphEntry() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST glyphEntry_AST = nullAST;
	
	try {      // for error handling
		{
		if ((LA(1)==IDENT) && (_tokenSet_22.member(LA(2)))) {
			glyphContents();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==IDENT) && (LA(2)==OP_LBRACE||LA(2)==OP_DOT)) {
			glyphAttrs();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp92_AST = nullAST;
			tmp92_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case LITERAL_environment:
		case LITERAL_endenvironment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		glyphEntry_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_21);
	}
	returnAST = glyphEntry_AST;
}